

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::writeCurrentTime(ofstream *out)

{
  tm *__src;
  ostream *poVar1;
  int local_50;
  int local_4c;
  tm tm;
  time_t t;
  ofstream *out_local;
  
  tm.tm_zone = (char *)::time((time_t *)0x0);
  __src = localtime((time_t *)&tm.tm_zone);
  memcpy(&local_50,__src,0x38);
  poVar1 = (ostream *)std::ostream::operator<<(out,tm.tm_mday + 0x76c);
  std::operator<<(poVar1,"-");
  if (tm.tm_hour < 10) {
    std::operator<<((ostream *)out,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(out,tm.tm_hour + 1);
  std::operator<<(poVar1,"-");
  if (tm.tm_min < 10) {
    std::operator<<((ostream *)out,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(out,tm.tm_min);
  std::operator<<(poVar1,"T");
  if (tm.tm_sec < 10) {
    std::operator<<((ostream *)out,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(out,tm.tm_sec);
  std::operator<<(poVar1,":");
  if (local_4c < 10) {
    std::operator<<((ostream *)out,"0");
  }
  poVar1 = (ostream *)std::ostream::operator<<(out,local_4c);
  std::operator<<(poVar1,":");
  if (local_50 < 10) {
    std::operator<<((ostream *)out,"0");
  }
  std::ostream::operator<<(out,local_50);
  return;
}

Assistant:

void writeCurrentTime( ofstream& out )
{
   auto t = time(nullptr);
   auto tm = *localtime(&t);

   out << tm.tm_year+1900 << "-";
   if( tm.tm_mon < 10 ) out << "0";
   out << tm.tm_mon+1 << "-";
   if( tm.tm_mday < 10 ) out << "0";
   out << tm.tm_mday << "T";
   if( tm.tm_hour < 10 ) out << "0";
   out << tm.tm_hour << ":";
   if( tm.tm_min < 10 ) out << "0";
   out << tm.tm_min << ":";
   if( tm.tm_sec < 10 ) out << "0";
   out << tm.tm_sec;
}